

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cpp
# Opt level: O2

void __thiscall YAML::Scanner::ScanToNextToken(Scanner *this)

{
  bool bVar1;
  char cVar2;
  int n;
  RegEx *pRVar3;
  RegEx RStack_48;
  
LAB_006a5334:
  do {
    bVar1 = YAML::Stream::operator_cast_to_bool(&this->INPUT);
    if (bVar1) {
      cVar2 = YAML::Stream::peek(&this->INPUT);
      if ((cVar2 == ' ') || (cVar2 == '\t')) {
        if ((this->m_flows).c.
            super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            (this->m_flows).c.
            super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          pRVar3 = Exp::Tab();
          bVar1 = RegEx::Matches(pRVar3,&this->INPUT);
          if (bVar1) {
            this->m_simpleKeyAllowed = false;
          }
        }
        YAML::Stream::eat(&this->INPUT,1);
        goto LAB_006a5334;
      }
    }
    Exp::Comment();
    bVar1 = RegEx::Matches(&RStack_48,&this->INPUT);
    std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&RStack_48.m_params);
    if (bVar1) {
      while( true ) {
        bVar1 = YAML::Stream::operator_cast_to_bool(&this->INPUT);
        if (!bVar1) break;
        pRVar3 = Exp::Break();
        bVar1 = RegEx::Matches(pRVar3,&this->INPUT);
        if (bVar1) break;
        YAML::Stream::eat(&this->INPUT,1);
      }
    }
    pRVar3 = Exp::Break();
    bVar1 = RegEx::Matches(pRVar3,&this->INPUT);
    if (!bVar1) {
      return;
    }
    pRVar3 = Exp::Break();
    n = RegEx::Match(pRVar3,&this->INPUT);
    YAML::Stream::eat(&this->INPUT,n);
    InvalidateSimpleKey(this);
    if ((this->m_flows).c.
        super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur ==
        (this->m_flows).c.
        super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>.
        _M_impl.super__Deque_impl_data._M_start._M_cur) {
      this->m_simpleKeyAllowed = true;
    }
  } while( true );
}

Assistant:

void Scanner::ScanToNextToken() {
  while (true) {
    // first eat whitespace
    while (INPUT && IsWhitespaceToBeEaten(INPUT.peek())) {
      if (InBlockContext() && Exp::Tab().Matches(INPUT)) {
        m_simpleKeyAllowed = false;
      }
      INPUT.eat(1);
    }

    // then eat a comment
    if (Exp::Comment().Matches(INPUT)) {
      // eat until line break
      while (INPUT && !Exp::Break().Matches(INPUT)) {
        INPUT.eat(1);
      }
    }

    // if it's NOT a line break, then we're done!
    if (!Exp::Break().Matches(INPUT)) {
      break;
    }

    // otherwise, let's eat the line break and keep going
    int n = Exp::Break().Match(INPUT);
    INPUT.eat(n);

    // oh yeah, and let's get rid of that simple key
    InvalidateSimpleKey();

    // new line - we may be able to accept a simple key now
    if (InBlockContext()) {
      m_simpleKeyAllowed = true;
    }
  }
}